

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O0

Float __thiscall
pbrt::HairBxDF::PDF(HairBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode,
                   BxDFReflTransFlags sampleFlags)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float *pfVar3;
  float *pfVar4;
  float *in_RDI;
  Float FVar5;
  double dVar6;
  undefined1 in_ZMM0 [64];
  undefined1 auVar7 [64];
  undefined1 auVar10 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  uint in_XMM1_Da;
  undefined1 auVar11 [64];
  undefined1 in_ZMM2 [64];
  uint in_XMM3_Da;
  array<float,_4> aVar13;
  Float in_stack_0000001c;
  Float cosThetap_o;
  Float sinThetap_o;
  int p;
  Float pdf;
  Float phi;
  array<float,_4> apPDF;
  Float gamma_t;
  Float sinGamma_t;
  Float etap;
  Float phi_i;
  Float cosTheta_i;
  Float sinTheta_i;
  Float phi_o;
  Float cosTheta_o;
  Float sinTheta_o;
  float gamma_t_00;
  Float gamma_o;
  float fVar14;
  Float in_stack_ffffffffffffff68;
  Float in_stack_ffffffffffffff6c;
  Float FVar15;
  Float cosTheta_i_00;
  array<float,_4> local_84;
  float local_74;
  float local_70;
  float local_6c;
  undefined4 local_68;
  float local_64;
  float local_60;
  undefined4 local_5c;
  float local_58;
  float local_54;
  ulong local_40;
  ulong local_30;
  uint local_28;
  ulong local_20;
  ulong local_10;
  uint local_8;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar12 [56];
  
  local_20 = vmovlpd_avx(in_ZMM0._0_16_);
  local_40 = vmovlpd_avx(in_ZMM2._0_16_);
  local_10._0_4_ = (float)local_20;
  local_54 = (float)local_10;
  local_30 = local_40;
  local_28 = in_XMM3_Da;
  fVar14 = (float)local_10;
  local_10 = local_20;
  local_8 = in_XMM1_Da;
  Sqr<float>(fVar14);
  gamma_o = 1.0;
  local_58 = SafeSqrt(0.0);
  dVar6 = std::atan2((double)(ulong)local_8,(double)(local_10 >> 0x20));
  local_5c = SUB84(dVar6,0);
  local_60 = (float)local_30;
  Sqr<float>((float)local_30);
  local_64 = SafeSqrt(0.0);
  dVar6 = std::atan2((double)(ulong)local_28,(double)(local_30 >> 0x20));
  local_68 = SUB84(dVar6,0);
  fVar14 = in_RDI[2];
  auVar7._0_4_ = Sqr<float>(local_54);
  auVar7._4_60_ = extraout_var;
  vfmsub213ss_fma(ZEXT416((uint)fVar14),ZEXT416((uint)fVar14),auVar7._0_16_);
  local_6c = SafeSqrt(0.0);
  local_6c = local_6c / local_58;
  auVar12 = (undefined1  [56])0x0;
  local_70 = *in_RDI / local_6c;
  local_74 = SafeASin(0.0);
  auVar10 = (undefined1  [56])0x0;
  pfVar4 = in_RDI;
  aVar13 = ComputeApPDF(_cosThetap_o,in_stack_0000001c);
  auVar11._0_8_ = aVar13.values._8_8_;
  auVar11._8_56_ = auVar12;
  auVar8._0_8_ = aVar13.values._0_8_;
  auVar8._8_56_ = auVar10;
  local_84.values._0_8_ = vmovlpd_avx(auVar8._0_16_);
  local_84.values._8_8_ = vmovlpd_avx(auVar11._0_16_);
  cosTheta_i_00 = 0.0;
  for (FVar15 = 0.0; (int)FVar15 < 3; FVar15 = (Float)((int)FVar15 + 1)) {
    if (FVar15 == 0.0) {
      auVar1 = vfmadd213ss_fma(ZEXT416((uint)pfVar4[0x12]),ZEXT416((uint)local_54),
                               ZEXT416((uint)-(local_58 * pfVar4[0xf])));
      auVar2 = vfmadd213ss_fma(ZEXT416((uint)pfVar4[0x12]),ZEXT416((uint)local_58),
                               ZEXT416((uint)(local_54 * pfVar4[0xf])));
      in_stack_ffffffffffffff68 = auVar2._0_4_;
      in_stack_ffffffffffffff6c = auVar1._0_4_;
    }
    else if (FVar15 == 1.4013e-45) {
      auVar1 = vfmadd213ss_fma(ZEXT416((uint)pfVar4[0x11]),ZEXT416((uint)local_54),
                               ZEXT416((uint)(local_58 * pfVar4[0xe])));
      auVar2 = vfmadd213ss_fma(ZEXT416((uint)pfVar4[0x11]),ZEXT416((uint)local_58),
                               ZEXT416((uint)-(local_54 * pfVar4[0xe])));
      in_stack_ffffffffffffff68 = auVar2._0_4_;
      in_stack_ffffffffffffff6c = auVar1._0_4_;
    }
    else {
      in_stack_ffffffffffffff68 = local_58;
      in_stack_ffffffffffffff6c = local_54;
      if (FVar15 == 2.8026e-45) {
        auVar1 = vfmadd213ss_fma(ZEXT416((uint)pfVar4[0x13]),ZEXT416((uint)local_54),
                                 ZEXT416((uint)(local_58 * pfVar4[0x10])));
        auVar2 = vfmadd213ss_fma(ZEXT416((uint)pfVar4[0x13]),ZEXT416((uint)local_58),
                                 ZEXT416((uint)-(local_54 * pfVar4[0x10])));
        in_stack_ffffffffffffff68 = auVar2._0_4_;
        in_stack_ffffffffffffff6c = auVar1._0_4_;
      }
    }
    std::abs((int)in_RDI);
    FVar5 = Mp(cosTheta_i_00,FVar15,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
               (Float)((ulong)pfVar4 >> 0x20));
    pfVar3 = pstd::array<float,_4>::operator[](&local_84,(long)(int)FVar15);
    gamma_t_00 = FVar5 * *pfVar3;
    in_RDI = (float *)(ulong)(uint)FVar15;
    auVar9._0_4_ = Np((Float)((ulong)pfVar4 >> 0x20),(int)pfVar4,fVar14,gamma_o,gamma_t_00);
    auVar9._4_60_ = extraout_var_00;
    auVar1 = vfmadd213ss_fma(auVar9._0_16_,ZEXT416((uint)gamma_t_00),ZEXT416((uint)cosTheta_i_00));
    cosTheta_i_00 = auVar1._0_4_;
  }
  FVar15 = Mp(cosTheta_i_00,FVar15,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
              (Float)((ulong)pfVar4 >> 0x20));
  pfVar4 = pstd::array<float,_4>::operator[](&local_84,3);
  auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3e22f983),0),ZEXT416((uint)(FVar15 * *pfVar4)),
                           ZEXT416((uint)cosTheta_i_00));
  return auVar1._0_4_;
}

Assistant:

Float HairBxDF::PDF(Vector3f wo, Vector3f wi, TransportMode mode,
                    BxDFReflTransFlags sampleFlags) const {
    // TODO? flags...

    // Compute hair coordinate system terms related to _wo_
    Float sinTheta_o = wo.x;
    Float cosTheta_o = SafeSqrt(1 - Sqr(sinTheta_o));
    Float phi_o = std::atan2(wo.z, wo.y);

    // Compute hair coordinate system terms related to _wi_
    Float sinTheta_i = wi.x;
    Float cosTheta_i = SafeSqrt(1 - Sqr(sinTheta_i));
    Float phi_i = std::atan2(wi.z, wi.y);

    // Compute $\gammat$ for refracted ray
    Float etap = SafeSqrt(eta * eta - Sqr(sinTheta_o)) / cosTheta_o;
    Float sinGamma_t = h / etap;
    Float gamma_t = SafeASin(sinGamma_t);

    // Compute PDF for $A_p$ terms
    pstd::array<Float, pMax + 1> apPDF = ComputeApPDF(cosTheta_o);

    // Compute PDF sum for hair scattering events
    Float phi = phi_i - phi_o;
    Float pdf = 0;
    for (int p = 0; p < pMax; ++p) {
        // Compute $\sin \thetao$ and $\cos \thetao$ terms accounting for scales
        Float sinThetap_o, cosThetap_o;
        if (p == 0) {
            sinThetap_o = sinTheta_o * cos2kAlpha[1] - cosTheta_o * sin2kAlpha[1];
            cosThetap_o = cosTheta_o * cos2kAlpha[1] + sinTheta_o * sin2kAlpha[1];
        }

        // Handle remainder of $p$ values for hair scale tilt
        else if (p == 1) {
            sinThetap_o = sinTheta_o * cos2kAlpha[0] + cosTheta_o * sin2kAlpha[0];
            cosThetap_o = cosTheta_o * cos2kAlpha[0] - sinTheta_o * sin2kAlpha[0];
        } else if (p == 2) {
            sinThetap_o = sinTheta_o * cos2kAlpha[2] + cosTheta_o * sin2kAlpha[2];
            cosThetap_o = cosTheta_o * cos2kAlpha[2] - sinTheta_o * sin2kAlpha[2];
        } else {
            sinThetap_o = sinTheta_o;
            cosThetap_o = cosTheta_o;
        }

        // Handle out-of-range $\cos \thetao$ from scale adjustment
        cosThetap_o = std::abs(cosThetap_o);
        pdf += Mp(cosTheta_i, cosThetap_o, sinTheta_i, sinThetap_o, v[p]) * apPDF[p] *
               Np(phi, p, s, gamma_o, gamma_t);
    }
    pdf += Mp(cosTheta_i, cosTheta_o, sinTheta_i, sinTheta_o, v[pMax]) * apPDF[pMax] *
           (1 / (2 * Pi));
    return pdf;
}